

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

StreamWriter * __thiscall Json::StreamWriterBuilder::newStreamWriter(StreamWriterBuilder *this)

{
  Enum cs_00;
  bool bVar1;
  Value *pVVar2;
  ulong uVar3;
  BuiltStyledStreamWriter *this_00;
  String local_1d0;
  String local_1b0;
  String local_190;
  String local_170;
  string local_150 [8];
  String endingLineFeedSymbol;
  string local_128 [8];
  String nullSymbol;
  string local_100 [8];
  String colonSymbol;
  String local_d8;
  PrecisionType local_b8;
  allocator<char> local_b1;
  PrecisionType precisionType;
  Enum local_8c;
  uint local_88;
  Enum cs;
  uint pre;
  bool emitUTF8;
  bool usf;
  bool dnp;
  bool eyc;
  String pt_str;
  undefined1 local_50 [8];
  String cs_str;
  String indentation;
  StreamWriterBuilder *this_local;
  
  pVVar2 = Value::operator[](&this->settings_,"indentation");
  Value::asString_abi_cxx11_((String *)((long)&cs_str.field_2 + 8),pVVar2);
  pVVar2 = Value::operator[](&this->settings_,"commentStyle");
  Value::asString_abi_cxx11_((String *)local_50,pVVar2);
  pVVar2 = Value::operator[](&this->settings_,"precisionType");
  Value::asString_abi_cxx11_((String *)&pre,pVVar2);
  pVVar2 = Value::operator[](&this->settings_,"enableYAMLCompatibility");
  cs._3_1_ = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](&this->settings_,"dropNullPlaceholders");
  cs._2_1_ = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](&this->settings_,"useSpecialFloats");
  cs._1_1_ = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](&this->settings_,"emitUTF8");
  cs._0_1_ = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](&this->settings_,"precision");
  local_88 = Value::asUInt(pVVar2);
  local_8c = 2;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,"All");
  if (bVar1) {
    local_8c = All;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"None");
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&precisionType,"commentStyle must be \'All\' or \'None\'",&local_b1);
      throwRuntimeError((String *)&precisionType);
    }
    local_8c = None;
  }
  local_b8 = 0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pre,
                          "significant");
  if (bVar1) {
    local_b8 = significantDigits;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &pre,"decimal");
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"precisionType must be \'significant\' or \'decimal\'",
                 (allocator<char> *)(colonSymbol.field_2._M_local_buf + 0xf));
      throwRuntimeError(&local_d8);
    }
    local_b8 = decimalPlaces;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100," : ",(allocator<char> *)(nullSymbol.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(nullSymbol.field_2._M_local_buf + 0xf));
  if ((cs._3_1_ & 1) == None >> 0x18) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=(local_100,":");
    }
  }
  else {
    std::__cxx11::string::operator=(local_100,": ");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"null",(allocator<char> *)(endingLineFeedSymbol.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(endingLineFeedSymbol.field_2._M_local_buf + 0xf));
  if ((cs._2_1_ & 1) != None >> 0x10) {
    std::__cxx11::string::clear();
  }
  if (0x11 < local_88) {
    local_88 = 0x11;
  }
  std::__cxx11::string::string(local_150);
  this_00 = (BuiltStyledStreamWriter *)operator_new(0xe8);
  std::__cxx11::string::string((string *)&local_170,(string *)(cs_str.field_2._M_local_buf + 8));
  cs_00 = local_8c;
  std::__cxx11::string::string((string *)&local_190,local_100);
  std::__cxx11::string::string((string *)&local_1b0,local_128);
  std::__cxx11::string::string((string *)&local_1d0,local_150);
  BuiltStyledStreamWriter::BuiltStyledStreamWriter
            (this_00,&local_170,cs_00,&local_190,&local_1b0,&local_1d0,(bool)(cs._1_1_ & 1),
             (bool)((undefined1)cs & Most),local_88,local_b8);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string((string *)&pre);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(cs_str.field_2._M_local_buf + 8));
  return &this_00->super_StreamWriter;
}

Assistant:

StreamWriter* StreamWriterBuilder::newStreamWriter() const {
  const String indentation = settings_["indentation"].asString();
  const String cs_str = settings_["commentStyle"].asString();
  const String pt_str = settings_["precisionType"].asString();
  const bool eyc = settings_["enableYAMLCompatibility"].asBool();
  const bool dnp = settings_["dropNullPlaceholders"].asBool();
  const bool usf = settings_["useSpecialFloats"].asBool();
  const bool emitUTF8 = settings_["emitUTF8"].asBool();
  unsigned int pre = settings_["precision"].asUInt();
  CommentStyle::Enum cs = CommentStyle::All;
  if (cs_str == "All") {
    cs = CommentStyle::All;
  } else if (cs_str == "None") {
    cs = CommentStyle::None;
  } else {
    throwRuntimeError("commentStyle must be 'All' or 'None'");
  }
  PrecisionType precisionType(significantDigits);
  if (pt_str == "significant") {
    precisionType = PrecisionType::significantDigits;
  } else if (pt_str == "decimal") {
    precisionType = PrecisionType::decimalPlaces;
  } else {
    throwRuntimeError("precisionType must be 'significant' or 'decimal'");
  }
  String colonSymbol = " : ";
  if (eyc) {
    colonSymbol = ": ";
  } else if (indentation.empty()) {
    colonSymbol = ":";
  }
  String nullSymbol = "null";
  if (dnp) {
    nullSymbol.clear();
  }
  if (pre > 17)
    pre = 17;
  String endingLineFeedSymbol;
  return new BuiltStyledStreamWriter(indentation, cs, colonSymbol, nullSymbol,
                                     endingLineFeedSymbol, usf, emitUTF8, pre,
                                     precisionType);
}